

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.h
# Opt level: O2

OutputStream * __thiscall OutputStream::operator+=(OutputStream *this,StringView R)

{
  size_t N;
  
  N = (long)R.Last - (long)R.First;
  if (N != 0) {
    grow(this,N);
    memmove(this->Buffer + this->CurrentPosition,R.First,N);
    this->CurrentPosition = this->CurrentPosition + N;
  }
  return this;
}

Assistant:

OutputStream &operator+=(StringView R) {
    size_t Size = R.size();
    if (Size == 0)
      return *this;
    grow(Size);
    std::memmove(Buffer + CurrentPosition, R.begin(), Size);
    CurrentPosition += Size;
    return *this;
  }